

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

void prvTidyFreeAnchors(TidyDocImpl *doc)

{
  Anchor *a;
  uint h;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x3fd; lVar1 = lVar1 + 1) {
    while (a = (doc->attribs).anchor_hash[lVar1], a != (Anchor *)0x0) {
      (doc->attribs).anchor_hash[lVar1] = a->next;
      FreeAnchor(doc,a);
    }
  }
  return;
}

Assistant:

void TY_(FreeAnchors)( TidyDocImpl* doc )
{
    TidyAttribImpl* attribs = &doc->attribs;
    Anchor* a;
    uint h;
    for (h = 0; h < ANCHOR_HASH_SIZE; h++) {
        while (NULL != (a = attribs->anchor_hash[h]) )
        {
            attribs->anchor_hash[h] = a->next;
            FreeAnchor(doc, a);
        }
    }
}